

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void ARM_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_struct *pcVar3;
  cs_detail *pcVar4;
  uint8_t uVar5;
  _Bool _Var6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  MCOperand *pMVar10;
  int64_t iVar11;
  MCRegisterClass *pMVar12;
  ulong uVar13;
  MCOperand *pMVar14;
  MCOperand *pMVar15;
  MCOperand *op;
  char *pcVar16;
  uint64_t uVar17;
  uint32_t val;
  ARM_AM_ShiftOpc AVar18;
  bool bVar19;
  uint uStack_3a0;
  MCInst NewMI;
  
  uVar7 = MCInst_getOpcode(MI);
  if (uVar7 == 0x72) goto LAB_001c9ab8;
  if (uVar7 == 0x7f) {
LAB_001c9af6:
    pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,1);
    pMVar10 = MCInst_getOperand(MI,(uint)(uVar7 == 0x199 || uVar7 == 0x1b4));
    uVar8 = MCOperand_getReg(pMVar10);
    _Var6 = MCRegisterClass_contains(pMVar12,uVar8);
    if (_Var6) {
      MCInst_Init(&NewMI);
      MCInst_setOpcode(&NewMI,uVar7);
      if ((uVar7 == 0x1b4) || (uVar7 == 0x199)) {
        pMVar10 = MCInst_getOperand(MI,0);
        MCInst_addOperand2(&NewMI,pMVar10);
        uVar7 = 3;
      }
      else {
        uVar7 = 2;
      }
      pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x12);
      uVar8 = MCRegisterInfo_getMatchingSuperReg((MCRegisterInfo *)Info,uVar8,9,pMVar12);
      MCOperand_CreateReg0(&NewMI,uVar8);
      for (; uVar8 = MCInst_getNumOperands(MI), uVar7 < uVar8; uVar7 = uVar7 + 1) {
        pMVar10 = MCInst_getOperand(MI,uVar7);
        MCInst_addOperand2(&NewMI,pMVar10);
      }
      printInstruction(&NewMI,O,(MCRegisterInfo *)Info);
      return;
    }
    goto switchD_001c9ae2_default;
  }
  if (uVar7 == 0x98) {
LAB_001c9c97:
    pMVar10 = MCInst_getOperand(MI,0);
    uVar8 = MCOperand_getReg(pMVar10);
    if ((uVar8 != 0xc) || (uVar8 = MCInst_getNumOperands(MI), uVar8 < 6))
    goto switchD_001c9ae2_default;
    SStream_concat0(O,"pop");
    MCInst_setOpcodePub(MI,0x1a7);
    printPredicateOperand(MI,2,O);
    if (uVar7 == 0x949) {
      SStream_concat0(O,".w");
    }
    SStream_concat0(O,anon_var_dwarf_2c47b8 + 0x11);
    MI->ac_idx = '\x01';
LAB_001c9d1a:
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar4 = MI->flat_insn->detail;
      bVar2 = pcVar4->regs_read_count;
      pcVar4->regs_read[bVar2] = 0xc;
      pcVar4->regs_read_count = bVar2 + 1;
      bVar2 = pcVar4->regs_write_count;
      pcVar4->regs_write[bVar2] = 0xc;
      pcVar4->regs_write_count = bVar2 + 1;
    }
  }
  else {
    if (uVar7 == 0xa9) goto LAB_001c9af6;
    if (uVar7 == 0xc0) {
      pMVar10 = MCInst_getOperand(MI,2);
      uVar7 = MCOperand_getReg(pMVar10);
      if (uVar7 == 0xc) {
        pMVar10 = MCInst_getOperand(MI,4);
        iVar11 = MCOperand_getImm(pMVar10);
        if (((((uint)iVar11 >> 0xc & 1) == 0) &&
            (iVar11 = MCOperand_getImm(pMVar10), ((uint)iVar11 & 0xfff) == 4)) ||
           (iVar11 = MCOperand_getImm(pMVar10), iVar11 == 4)) {
          SStream_concat0(O,"pop");
          MCInst_setOpcodePub(MI,0x1a7);
          printPredicateOperand(MI,5,O);
          SStream_concat0(O,"\t{");
          pcVar3 = MI->csh;
          pMVar10 = MCInst_getOperand(MI,0);
          uVar7 = MCOperand_getReg(pMVar10);
          printRegName(pcVar3,O,uVar7);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar4 = MI->flat_insn->detail;
            puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x41;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            pMVar10 = MCInst_getOperand(MI,0);
            uVar7 = MCOperand_getReg(pMVar10);
            pcVar4 = MI->flat_insn->detail;
            *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x45) = uVar7;
            pcVar4 = MI->flat_insn->detail;
            pcVar4->groups[(ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x5e] = '\x02';
            puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar1 = *puVar1 + '\x01';
            pcVar4 = MI->flat_insn->detail;
            bVar2 = pcVar4->regs_read_count;
            pcVar4->regs_read[bVar2] = 0xc;
            pcVar4->regs_read_count = bVar2 + 1;
            bVar2 = pcVar4->regs_write_count;
            pcVar4->regs_write[bVar2] = 0xc;
            pcVar4->regs_write_count = bVar2 + 1;
          }
LAB_001ca70c:
          SStream_concat0(O,"}");
          return;
        }
      }
      goto switchD_001c9ae2_default;
    }
    if (uVar7 == 0xe6) {
      pMVar10 = MCInst_getOperand(MI,0);
      pMVar14 = MCInst_getOperand(MI,1);
      pMVar15 = MCInst_getOperand(MI,2);
      iVar11 = MCOperand_getImm(pMVar15);
      AVar18 = (ARM_AM_ShiftOpc)iVar11 & (ARM_AM_ror|ARM_AM_lsr);
      pcVar16 = ARM_AM_getShiftOpcStr(AVar18);
      SStream_concat0(O,pcVar16);
      if (AVar18 - ARM_AM_asr < 5) {
        MCInst_setOpcodePub(MI,*(uint *)(&DAT_00303220 + (ulong)(AVar18 - ARM_AM_asr) * 4));
      }
      printSBitModifierOperand(MI,5,O);
      printPredicateOperand(MI,3,O);
      SStream_concat0(O,anon_var_dwarf_2c47b8 + 0x11);
      pcVar3 = MI->csh;
      uVar7 = MCOperand_getReg(pMVar10);
      printRegName(pcVar3,O,uVar7);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x41;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar7 = MCOperand_getReg(pMVar10);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x45) = uVar7;
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x5e] = '\x02';
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      SStream_concat0(O,", ");
      pcVar3 = MI->csh;
      uVar7 = MCOperand_getReg(pMVar14);
      printRegName(pcVar3,O,uVar7);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x41;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar7 = MCOperand_getReg(pMVar14);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x45) = uVar7;
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x5e] = '\x01';
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      if (AVar18 == ARM_AM_rrx) {
        return;
      }
      SStream_concat0(O,", ");
      uVar13 = MCOperand_getImm(pMVar15);
      val = 0x20;
      if (7 < (uint)uVar13) {
        val = (uint)(uVar13 >> 3) & 0x1fffffff;
      }
      printUInt32Bang(O,val);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar4 = MI->flat_insn->detail;
      *(ARM_AM_ShiftOpc *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 9) =
           AVar18;
      pcVar4 = MI->flat_insn->detail;
      *(uint32_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0xd) = val;
      return;
    }
    if (uVar7 == 0xe7) {
      pMVar10 = MCInst_getOperand(MI,0);
      pMVar14 = MCInst_getOperand(MI,1);
      pMVar15 = MCInst_getOperand(MI,2);
      op = MCInst_getOperand(MI,3);
      iVar11 = MCOperand_getImm(op);
      AVar18 = (ARM_AM_ShiftOpc)iVar11 & (ARM_AM_ror|ARM_AM_lsr);
      pcVar16 = ARM_AM_getShiftOpcStr(AVar18);
      SStream_concat0(O,pcVar16);
      uVar7 = AVar18 - ARM_AM_asr;
      if (uVar7 < 5) {
        MCInst_setOpcodePub(MI,*(uint *)(&DAT_00303220 + (ulong)uVar7 * 4));
      }
      printSBitModifierOperand(MI,6,O);
      printPredicateOperand(MI,4,O);
      SStream_concat0(O,anon_var_dwarf_2c47b8 + 0x11);
      pcVar3 = MI->csh;
      uVar7 = MCOperand_getReg(pMVar10);
      printRegName(pcVar3,O,uVar7);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x41;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar7 = MCOperand_getReg(pMVar10);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x45) = uVar7;
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x5e] = '\x02';
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      SStream_concat0(O,", ");
      pcVar3 = MI->csh;
      uVar7 = MCOperand_getReg(pMVar14);
      printRegName(pcVar3,O,uVar7);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x41;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar7 = MCOperand_getReg(pMVar14);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x45) = uVar7;
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x5e] = '\x01';
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      SStream_concat0(O,", ");
      pcVar3 = MI->csh;
      uVar7 = MCOperand_getReg(pMVar15);
      printRegName(pcVar3,O,uVar7);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x41;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar7 = MCOperand_getReg(pMVar15);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x45) = uVar7;
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x5e] = '\x01';
      puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
      *puVar1 = *puVar1 + '\x01';
      return;
    }
    if (uVar7 == 0x199) goto LAB_001c9af6;
    if (uVar7 == 0x19f) {
LAB_001c9b89:
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if ((uVar8 != 0xc) || (uVar8 = MCInst_getNumOperands(MI), uVar8 < 6))
      goto switchD_001c9ae2_default;
      SStream_concat0(O,"push");
      MCInst_setOpcodePub(MI,0x1a8);
      printPredicateOperand(MI,2,O);
      if (uVar7 == 0xa2e) {
        SStream_concat0(O,".w");
      }
      SStream_concat0(O,anon_var_dwarf_2c47b8 + 0x11);
      goto LAB_001c9d1a;
    }
    if (uVar7 == 0x1b4) goto LAB_001c9af6;
    if (uVar7 == 0x1c1) {
      pMVar10 = MCInst_getOperand(MI,2);
      uVar7 = MCOperand_getReg(pMVar10);
      if (uVar7 == 0xc) {
        pMVar10 = MCInst_getOperand(MI,3);
        iVar11 = MCOperand_getImm(pMVar10);
        if (iVar11 == -4) {
          SStream_concat0(O,"push");
          MCInst_setOpcodePub(MI,0x1a8);
          printPredicateOperand(MI,4,O);
          SStream_concat0(O,"\t{");
          pcVar3 = MI->csh;
          pMVar10 = MCInst_getOperand(MI,1);
          uVar7 = MCOperand_getReg(pMVar10);
          printRegName(pcVar3,O,uVar7);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar4 = MI->flat_insn->detail;
            puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x41;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            pMVar10 = MCInst_getOperand(MI,1);
            uVar7 = MCOperand_getReg(pMVar10);
            pcVar4 = MI->flat_insn->detail;
            *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x45) = uVar7;
            pcVar3 = MI->csh;
            uVar7 = MCInst_getOpcode(MI);
            uVar5 = get_op_access(pcVar3,uVar7,(uint)MI->ac_idx);
            pcVar4 = MI->flat_insn->detail;
            pcVar4->groups[(ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x5e] = uVar5;
            MI->ac_idx = MI->ac_idx + '\x01';
            puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar1 = *puVar1 + '\x01';
          }
          goto LAB_001ca70c;
        }
      }
      goto switchD_001c9ae2_default;
    }
    if ((uVar7 == 0x4e7) || (uVar7 == 0x4eb)) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar7 = MCOperand_getReg(pMVar10);
      if (uVar7 != 0xc) goto switchD_001c9ae2_default;
      SStream_concat0(O,"vpop");
      uVar7 = 0x1b0;
    }
    else {
      if ((uVar7 != 0x883) && (uVar7 != 0x887)) {
        if (uVar7 != 0x928) {
          if (uVar7 == 0x949) goto LAB_001c9c97;
          if (uVar7 == 0xa2e) goto LAB_001c9b89;
          if (uVar7 == 0xa4d) {
            pMVar10 = MCInst_getOperand(MI,0);
            uVar7 = MCInst_getNumOperands(MI);
            if ((((uVar7 == 3) && (_Var6 = MCOperand_isImm(pMVar10), _Var6)) &&
                (iVar11 = MCOperand_getImm(pMVar10), iVar11 == 0)) &&
               (uVar17 = ARM_getFeatureBits(MI->csh->mode), (uVar17 >> 0x20 & 1) != 0)) {
              SStream_concat0(O,"eret");
              MCInst_setOpcodePub(MI,0x23);
              printPredicateOperand(MI,1,O);
              return;
            }
            goto switchD_001c9ae2_default;
          }
          if (uVar7 == 0xab1) {
            pMVar10 = MCInst_getOperand(MI,0);
            uVar8 = MCOperand_getReg(pMVar10);
            bVar19 = true;
            for (uVar7 = 3; uVar9 = MCInst_getNumOperands(MI), uVar7 < uVar9; uVar7 = uVar7 + 1) {
              pMVar10 = MCInst_getOperand(MI,uVar7);
              uVar9 = MCOperand_getReg(pMVar10);
              bVar19 = (bool)(bVar19 & uVar9 != uVar8);
            }
            SStream_concat0(O,"ldm");
            MCInst_setOpcodePub(MI,0x3b);
            printPredicateOperand(MI,1,O);
            SStream_concat0(O,anon_var_dwarf_2c47b8 + 0x11);
            printRegName(MI->csh,O,uVar8);
            if (MI->csh->detail != CS_OPT_OFF) {
              pcVar4 = MI->flat_insn->detail;
              puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x41;
              puVar1[0] = '\x01';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              pcVar4 = MI->flat_insn->detail;
              *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x45) =
                   uVar8;
              pcVar4 = MI->flat_insn->detail;
              pcVar4->groups[(ulong)(pcVar4->field_6).arm.op_count * 0x30 + 0x5e] = '\x03';
              puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
              *puVar1 = *puVar1 + '\x01';
            }
            if (bVar19) {
              MI->writeback = true;
              SStream_concat0(O,"!");
            }
            SStream_concat0(O,", ");
            uStack_3a0 = 3;
            goto LAB_001ca24a;
          }
          if (uVar7 != 0xaad) goto switchD_001c9ae2_default;
        }
LAB_001c9ab8:
        pMVar10 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar10);
        switch(iVar11) {
        case 0:
          uVar8 = 0x1a9;
          pcVar16 = "nop";
          break;
        case 1:
          uVar8 = 0x1aa;
          pcVar16 = "yield";
          break;
        case 2:
          uVar8 = 0x1ab;
          pcVar16 = "wfe";
          break;
        case 3:
          uVar8 = 0x1ac;
          pcVar16 = "wfi";
          break;
        case 4:
          uVar8 = 0x1ad;
          pcVar16 = "sev";
          break;
        case 5:
          uVar17 = ARM_getFeatureBits(MI->csh->mode);
          if ((uVar17 >> 0x29 & 1) != 0) {
            uVar8 = 0x1ae;
            pcVar16 = "sevl";
            break;
          }
        default:
switchD_001c9ae2_default:
          printInstruction(MI,O,(MCRegisterInfo *)Info);
          return;
        }
        SStream_concat0(O,pcVar16);
        printPredicateOperand(MI,1,O);
        if (uVar7 == 0x928) {
          SStream_concat0(O,".w");
        }
        MCInst_setOpcodePub(MI,uVar8);
        return;
      }
      pMVar10 = MCInst_getOperand(MI,0);
      uVar7 = MCOperand_getReg(pMVar10);
      if (uVar7 != 0xc) goto switchD_001c9ae2_default;
      SStream_concat0(O,"vpush");
      uVar7 = 0x1af;
    }
    MCInst_setOpcodePub(MI,uVar7);
    printPredicateOperand(MI,2,O);
    SStream_concat0(O,anon_var_dwarf_2c47b8 + 0x11);
  }
  uStack_3a0 = 4;
LAB_001ca24a:
  printRegisterList(MI,uStack_3a0,O);
  return;
}

Assistant:

void ARM_printInst(MCInst *MI, SStream *O, void *Info)
{
	MCRegisterInfo *MRI = (MCRegisterInfo *)Info;
	unsigned Opcode = MCInst_getOpcode(MI), tmp, i, pubOpcode;


	// printf(">>> Opcode 0: %u\n", MCInst_getOpcode(MI));
	switch(Opcode) {
		// Check for HINT instructions w/ canonical names.
		case ARM_HINT:
		case ARM_tHINT:
		case ARM_t2HINT:
			switch (MCOperand_getImm(MCInst_getOperand(MI, 0))) {
				case 0: SStream_concat0(O, "nop"); pubOpcode = ARM_INS_NOP; break;
				case 1: SStream_concat0(O, "yield"); pubOpcode = ARM_INS_YIELD; break;
				case 2: SStream_concat0(O, "wfe"); pubOpcode = ARM_INS_WFE; break;
				case 3: SStream_concat0(O, "wfi"); pubOpcode = ARM_INS_WFI; break;
				case 4: SStream_concat0(O, "sev"); pubOpcode = ARM_INS_SEV; break;
				case 5:
						if ((ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops)) {
							SStream_concat0(O, "sevl");
							pubOpcode = ARM_INS_SEVL;
							break;
						}
						// Fallthrough for non-v8
				default:
						// Anything else should just print normally.
						printInstruction(MI, O, MRI);
						return;
			}
			printPredicateOperand(MI, 1, O);
			if (Opcode == ARM_t2HINT)
				SStream_concat0(O, ".w");

			MCInst_setOpcodePub(MI, pubOpcode);

			return;

			// Check for MOVs and print canonical forms, instead.
		case ARM_MOVsr: {
							// FIXME: Thumb variants?
							unsigned int opc;
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);
							MCOperand *MO3 = MCInst_getOperand(MI, 3);

							opc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3));
							SStream_concat0(O, ARM_AM_getShiftOpcStr(opc));
							switch(opc) {
								default:
									break;
								case ARM_AM_asr:
									MCInst_setOpcodePub(MI, ARM_INS_ASR);
									break;
								case ARM_AM_lsl:
									MCInst_setOpcodePub(MI, ARM_INS_LSL);
									break;
								case ARM_AM_lsr:
									MCInst_setOpcodePub(MI, ARM_INS_LSR);
									break;
								case ARM_AM_ror:
									MCInst_setOpcodePub(MI, ARM_INS_ROR);
									break;
								case ARM_AM_rrx:
									MCInst_setOpcodePub(MI, ARM_INS_RRX);
									break;
							}
							printSBitModifierOperand(MI, 6, O);
							printPredicateOperand(MI, 4, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));

							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO2));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO2);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}
							//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
							return;
						}

		case ARM_MOVsi: {
							// FIXME: Thumb variants?
							unsigned int opc;
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);

							opc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2));
							SStream_concat0(O, ARM_AM_getShiftOpcStr(opc));
							switch(opc) {
								default:
									break;
								case ARM_AM_asr:
									MCInst_setOpcodePub(MI, ARM_INS_ASR);
									break;
								case ARM_AM_lsl:
									MCInst_setOpcodePub(MI, ARM_INS_LSL);
									break;
								case ARM_AM_lsr:
									MCInst_setOpcodePub(MI, ARM_INS_LSR);
									break;
								case ARM_AM_ror:
									MCInst_setOpcodePub(MI, ARM_INS_ROR);
									break;
								case ARM_AM_rrx:
									MCInst_setOpcodePub(MI, ARM_INS_RRX);
									break;
							}
							printSBitModifierOperand(MI, 5, O);
							printPredicateOperand(MI, 3, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}

							if (opc == ARM_AM_rrx) {
								//printAnnotation(O, Annot);
								return;
							}

							SStream_concat0(O, ", ");
							tmp = translateShiftImm(getSORegOffset((unsigned int)MCOperand_getImm(MO2)));
							printUInt32Bang(O, tmp);
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type =
									(arm_shifter)opc;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
							}
							return;
						}

						// A8.6.123 PUSH
		case ARM_STMDB_UPD:
		case ARM_t2STMDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print PUSH if there are at least two registers in the list.
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2STMDB_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");

							if (MI->csh->detail) {
								MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_read_count++;
								MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_write_count++;
							}

							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_STR_PRE_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP &&
								MCOperand_getImm(MCInst_getOperand(MI, 3)) == -4) {
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 4, O);
							SStream_concat0(O, "\t{");
							printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 1)));
							if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
								uint8_t access;
#endif
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 1));
#ifndef CAPSTONE_DIET
								access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
								MI->ac_idx++;
#endif
								MI->flat_insn->detail->arm.op_count++;
							}
							SStream_concat0(O, "}");
							return;
						}
						break;

						// A8.6.122 POP
		case ARM_LDMIA_UPD:
		case ARM_t2LDMIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print POP if there are at least two registers in the list.
							SStream_concat0(O, "pop");
							MCInst_setOpcodePub(MI, ARM_INS_POP);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2LDMIA_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							// unlike LDM, POP only write to registers, so skip the 1st access code
							MI->ac_idx = 1;
							if (MI->csh->detail) {
								MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_read_count++;
								MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_write_count++;
							}

							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_LDR_POST_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP) {
							MCOperand *MO2 = MCInst_getOperand(MI, 4);
							if ((getAM2Op((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_add &&
										getAM2Offset((unsigned int)MCOperand_getImm(MO2)) == 4) ||
									MCOperand_getImm(MO2) == 4) {
								SStream_concat0(O, "pop");
								MCInst_setOpcodePub(MI, ARM_INS_POP);
								printPredicateOperand(MI, 5, O);
								SStream_concat0(O, "\t{");
								printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 0)));
								if (MI->csh->detail) {
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 0));
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
									MI->flat_insn->detail->arm.op_count++;
                                    // this instruction implicitly read/write SP register
                                    MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
                                    MI->flat_insn->detail->regs_read_count++;
                                    MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
                                    MI->flat_insn->detail->regs_write_count++;
								}
								SStream_concat0(O, "}");
								return;
							}
						}
						break;

						// A8.6.355 VPUSH
		case ARM_VSTMSDB_UPD:
		case ARM_VSTMDDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpush");
							MCInst_setOpcodePub(MI, ARM_INS_VPUSH);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

						// A8.6.354 VPOP
		case ARM_VLDMSIA_UPD:
		case ARM_VLDMDIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpop");
							MCInst_setOpcodePub(MI, ARM_INS_VPOP);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_tLDMIA: {
							 bool Writeback = true;
							 unsigned BaseReg = MCOperand_getReg(MCInst_getOperand(MI, 0));
							 unsigned i;
							 for (i = 3; i < MCInst_getNumOperands(MI); ++i) {
								 if (MCOperand_getReg(MCInst_getOperand(MI, i)) == BaseReg)
									 Writeback = false;
							 }

							 SStream_concat0(O, "ldm");
							 MCInst_setOpcodePub(MI, ARM_INS_LDM);

							 printPredicateOperand(MI, 1, O);
							 SStream_concat0(O, "\t");
							 printRegName(MI->csh, O, BaseReg);
							 if (MI->csh->detail) {
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = BaseReg;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ | CS_AC_WRITE;
								 MI->flat_insn->detail->arm.op_count++;
							 }
							 if (Writeback) {
								 MI->writeback = true;
								 SStream_concat0(O, "!");
							 }
							 SStream_concat0(O, ", ");
							 printRegisterList(MI, 3, O);
							 return;
						 }

						 // Combine 2 GPRs from disassember into a GPRPair to match with instr def.
						 // ldrexd/strexd require even/odd GPR pair. To enforce this constraint,
						 // a single GPRPair reg operand is used in the .td file to replace the two
						 // GPRs. However, when decoding them, the two GRPs cannot be automatically
						 // expressed as a GPRPair, so we have to manually merge them.
						 // FIXME: We would really like to be able to tablegen'erate this.
		case ARM_LDREXD:
		case ARM_STREXD:
		case ARM_LDAEXD:
		case ARM_STLEXD: {
				const MCRegisterClass* MRC = MCRegisterInfo_getRegClass(MRI, ARM_GPRRegClassID);
				bool isStore = Opcode == ARM_STREXD || Opcode == ARM_STLEXD;
				unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, isStore ? 1 : 0));

				if (MCRegisterClass_contains(MRC, Reg)) {
				    MCInst NewMI;

				    MCInst_Init(&NewMI);
				    MCInst_setOpcode(&NewMI, Opcode);

				    if (isStore)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, 0));

				    MCOperand_CreateReg0(&NewMI, MCRegisterInfo_getMatchingSuperReg(MRI, Reg, ARM_gsub_0,
								MCRegisterInfo_getRegClass(MRI, ARM_GPRPairRegClassID)));

				    // Copy the rest operands into NewMI.
				    for(i = isStore ? 3 : 2; i < MCInst_getNumOperands(MI); ++i)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, i));

				    printInstruction(&NewMI, O, MRI);
				    return;
				}
				break;
		 }
		 // B9.3.3 ERET (Thumb)
		 // For a target that has Virtualization Extensions, ERET is the preferred
		 // disassembly of SUBS PC, LR, #0
		case ARM_t2SUBS_PC_LR: {
						MCOperand *opc = MCInst_getOperand(MI, 0);
						if (MCInst_getNumOperands(MI) == 3 &&
							MCOperand_isImm(opc) &&
							MCOperand_getImm(opc) == 0 &&
							(ARM_getFeatureBits(MI->csh->mode) & ARM_FeatureVirtualization)) {
							SStream_concat0(O, "eret");
							MCInst_setOpcodePub(MI, ARM_INS_ERET);
							printPredicateOperand(MI, 1, O);
							return;
						}
						break;
				}
	}

	//if (printAliasInstr(MI, O, MRI))
	//	printInstruction(MI, O, MRI);
	printInstruction(MI, O, MRI);
}